

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

index_t __thiscall
GEO::PeriodicDelaunay3dThread::create_first_tetrahedron(PeriodicDelaunay3dThread *this)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  pointer piVar6;
  uint uVar7;
  bool bVar8;
  Sign SVar9;
  index_t iVar10;
  index_t iVar11;
  index_t f_1;
  uint uVar12;
  uint uVar13;
  int iVar14;
  char *pcVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  index_t f;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  index_t t [4];
  index_t aiStack_58 [4];
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  iVar10 = 0xffffffff;
  if (3 < this->nb_vertices_) {
    uVar19 = (this->super_Periodic).nb_vertices_non_periodic_;
    uVar21 = 1;
    if (1 < (ulong)uVar19) {
      pdVar5 = this->vertices_;
      uVar21 = 1;
      uVar17 = 3;
      do {
        uVar18 = uVar17 & 0xffffffff;
        if ((((*pdVar5 != pdVar5[uVar18]) || (NAN(*pdVar5) || NAN(pdVar5[uVar18]))) ||
            (pdVar5[1] != pdVar5[uVar18 + 1])) ||
           (((NAN(pdVar5[1]) || NAN(pdVar5[uVar18 + 1]) || (pdVar5[2] != pdVar5[uVar18 + 2])) ||
            (NAN(pdVar5[2]) || NAN(pdVar5[uVar18 + 2]))))) goto LAB_001700ab;
        uVar21 = (ulong)((int)uVar21 + 1);
        uVar17 = uVar17 + 3;
      } while ((ulong)uVar19 * 3 != uVar17);
      uVar21 = (ulong)uVar19;
    }
LAB_001700ab:
    uVar19 = (uint)uVar21;
    if (uVar19 != this->nb_vertices_) {
      uVar7 = uVar19 * 3 + 6;
      uVar13 = uVar19;
      do {
        uVar12 = uVar13;
        uVar16 = uVar7;
        uVar13 = uVar12 + 1;
        if ((this->super_Periodic).nb_vertices_non_periodic_ <= uVar13) break;
        pdVar5 = this->vertices_;
        bVar8 = PCK::points_are_colinear_3d(pdVar5,pdVar5 + uVar19 * 3,pdVar5 + (uVar16 - 3));
        uVar7 = uVar16 + 3;
      } while (bVar8);
      if (this->nb_vertices_ == uVar13) {
        iVar10 = 0xffffffff;
      }
      else {
        uVar20 = uVar16 - 3;
        uVar7 = uVar12 + 2;
        local_48 = uVar21;
        do {
          uVar12 = uVar7;
          if ((this->super_Periodic).nb_vertices_non_periodic_ <= uVar12) {
            SVar9 = ZERO;
            break;
          }
          pdVar5 = this->vertices_;
          SVar9 = PCK::orient_3d(pdVar5,pdVar5 + uVar19 * 3,pdVar5 + uVar20,pdVar5 + uVar16);
          uVar16 = uVar16 + 3;
          uVar7 = uVar12 + 1;
        } while (SVar9 == ZERO);
        uVar21 = local_48;
        iVar10 = 0xffffffff;
        if (this->nb_vertices_ != uVar12) {
          uVar19 = uVar12;
          if (SVar9 == NEGATIVE) {
            uVar19 = uVar13;
            uVar13 = uVar12;
          }
          iVar10 = new_tetrahedron(this);
          local_40 = (ulong)(iVar10 << 2);
          piVar6 = (this->cell_to_v_store_->
                   super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                   super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar6[local_40] = 0;
          piVar6[local_40 + 1] = (int)uVar21;
          piVar6[local_40 + 2] = uVar13;
          piVar6[local_40 + 3] = uVar19;
          pcVar15 = &DAT_001aab22;
          lVar22 = 0;
          local_38 = (ulong)uVar19;
          do {
            iVar14 = (int)local_40;
            piVar6 = (this->cell_to_v_store_->
                     super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                     super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar3 = piVar6[(uint)(*pcVar15 + iVar14)];
            iVar4 = piVar6[(uint)(pcVar15[-1] + iVar14)];
            iVar14 = piVar6[(uint)(pcVar15[-2] + iVar14)];
            iVar11 = new_tetrahedron(this);
            uVar21 = (ulong)(iVar11 * 4);
            piVar6 = (this->cell_to_v_store_->
                     super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                     super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar6[uVar21] = -1;
            piVar6[uVar21 + 1] = iVar3;
            piVar6[uVar21 + 2] = iVar4;
            piVar6[uVar21 + 3] = iVar14;
            aiStack_58[lVar22] = iVar11;
            lVar22 = lVar22 + 1;
            pcVar15 = pcVar15 + 3;
          } while (lVar22 != 4);
          piVar6 = (this->cell_to_cell_store_->
                   super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                   super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar22 = 0;
          do {
            iVar11 = aiStack_58[lVar22];
            piVar6[iVar11 * 4] = iVar10;
            piVar6[(local_40 & 0xffffffff) + lVar22] = iVar11;
            lVar22 = lVar22 + 1;
          } while (lVar22 != 4);
          pcVar15 = &DAT_001aab22;
          piVar6 = (this->cell_to_cell_store_->
                   super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                   super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar22 = 0;
          do {
            cVar1 = pcVar15[-1];
            cVar2 = pcVar15[-2];
            uVar21 = (ulong)(aiStack_58[lVar22] << 2);
            piVar6[uVar21 + 1] = aiStack_58[(uint)(int)*pcVar15];
            piVar6[uVar21 + 2] = aiStack_58[(long)cVar1 & 0xffffffff];
            piVar6[uVar21 + 3] = aiStack_58[(long)cVar2 & 0xffffffff];
            lVar22 = lVar22 + 1;
            pcVar15 = pcVar15 + 3;
          } while (lVar22 != 4);
          this->v1_ = 0;
          this->v2_ = (index_t)local_48;
          this->v3_ = uVar13;
          this->v4_ = (index_t)local_38;
          release_tets(this);
        }
      }
    }
  }
  return iVar10;
}

Assistant:

index_t nb_vertices() const {
            return nb_vertices_;
        }